

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweep.c
# Opt level: O0

Gia_Man_t * Gia_ManFraigReduceGia(Gia_Man_t *p,int *pReprs)

{
  int iVar1;
  int iLit1;
  uint uVar2;
  Gia_Man_t *p_00;
  char *pcVar3;
  bool bVar4;
  int local_2c;
  Gia_Obj_t *pGStack_28;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pNew;
  int *pReprs_local;
  Gia_Man_t *p_local;
  
  if (pReprs == (int *)0x0) {
    __assert_fail("pReprs != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                  ,0x15f,"Gia_Man_t *Gia_ManFraigReduceGia(Gia_Man_t *, int *)");
  }
  iVar1 = Gia_ManRegNum(p);
  if (iVar1 != 0) {
    __assert_fail("Gia_ManRegNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                  ,0x160,"Gia_Man_t *Gia_ManFraigReduceGia(Gia_Man_t *, int *)");
  }
  iVar1 = Gia_ManObjNum(p);
  p_00 = Gia_ManStart(iVar1);
  pcVar3 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar3;
  Gia_ManFillValue(p);
  Gia_ManHashAlloc(p_00);
  local_2c = 0;
  while( true ) {
    bVar4 = false;
    if (local_2c < p->nObjs) {
      pGStack_28 = Gia_ManObj(p,local_2c);
      bVar4 = pGStack_28 != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    iVar1 = Gia_ObjIsAnd(pGStack_28);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsCi(pGStack_28);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsCo(pGStack_28);
        if (iVar1 == 0) {
          iVar1 = Gia_ObjIsConst0(pGStack_28);
          if (iVar1 == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                          ,0x170,"Gia_Man_t *Gia_ManFraigReduceGia(Gia_Man_t *, int *)");
          }
          pGStack_28->Value = 0;
        }
        else {
          iVar1 = Gia_ObjFanin0CopyRepr(p,pGStack_28,pReprs);
          uVar2 = Gia_ManAppendCo(p_00,iVar1);
          pGStack_28->Value = uVar2;
        }
      }
      else {
        uVar2 = Gia_ManAppendCi(p_00);
        pGStack_28->Value = uVar2;
      }
    }
    else {
      iVar1 = Gia_ObjFanin0CopyRepr(p,pGStack_28,pReprs);
      iLit1 = Gia_ObjFanin1CopyRepr(p,pGStack_28,pReprs);
      uVar2 = Gia_ManHashAnd(p_00,iVar1,iLit1);
      pGStack_28->Value = uVar2;
    }
    local_2c = local_2c + 1;
  }
  Gia_ManHashStop(p_00);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManFraigReduceGia( Gia_Man_t * p, int * pReprs )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    assert( pReprs != NULL );
    assert( Gia_ManRegNum(p) == 0 );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManFillValue( p );
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0CopyRepr(p, pObj, pReprs), Gia_ObjFanin1CopyRepr(p, pObj, pReprs) );
        else if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Gia_ManAppendCi( pNew );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0CopyRepr(p, pObj, pReprs) );
        else if ( Gia_ObjIsConst0(pObj) )
            pObj->Value = 0;
        else assert( 0 );
    }
    Gia_ManHashStop( pNew );
    return pNew;
}